

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

optional<pbrt::MediumInteraction> * __thiscall
pstd::optional<pbrt::MediumInteraction>::operator=
          (optional<pbrt::MediumInteraction> *this,MediumInteraction *v)

{
  optional<pbrt::MediumInteraction> *in_RSI;
  optional<pbrt::MediumInteraction> *in_RDI;
  
  reset(in_RSI);
  ptr((optional<pbrt::MediumInteraction> *)0x83b0a5);
  pbrt::MediumInteraction::MediumInteraction
            ((MediumInteraction *)in_RSI,(MediumInteraction *)in_RDI);
  in_RDI->set = true;
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    optional &operator=(const T &v) {
        reset();
        new (ptr()) T(v);
        set = true;
        return *this;
    }